

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O0

MPP_RET vdpu_av1d_init(void *hal,MppHalCfg *cfg)

{
  long lVar1;
  MPP_RET MVar2;
  VdpuAv1dRegCtx *reg_ctx;
  Av1dHalCtx *p_hal;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","input empty(%d).\n",(char *)0x0,0x109);
    }
  }
  else {
    MVar2 = hal_av1d_alloc_res(hal);
    if (MVar2 < MPP_OK) {
      if ((hal_av1d_debug & 4) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","Function error(%d).\n",(char *)0x0,0x10b);
      }
      vdpu_av1d_deinit(hal);
    }
    else {
      lVar1 = *(long *)((long)hal + 0x50);
      *(long *)(lVar1 + 0x98) = lVar1 + 0xa8;
      *(long *)(lVar1 + 0xa0) = lVar1 + 0x3088;
      *(undefined1 *)(lVar1 + 0x1e783) = 1;
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_HOR_ALIGN,rkv_hor_align);
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_VER_ALIGN,rkv_ver_align);
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_LEN_ALIGN,rkv_len_align);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    INP_CHECK(ret, NULL == p_hal);

    FUN_CHECK(hal_av1d_alloc_res(hal));

    {
        VdpuAv1dRegCtx *reg_ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;

        reg_ctx->cdfs = &reg_ctx->default_cdfs;
        reg_ctx->cdfs_ndvc = &reg_ctx->default_cdfs_ndvc;
        reg_ctx->tile_transpose = 1;
    }

    mpp_slots_set_prop(p_hal->slots, SLOTS_HOR_ALIGN, rkv_hor_align);
    mpp_slots_set_prop(p_hal->slots, SLOTS_VER_ALIGN, rkv_ver_align);
    mpp_slots_set_prop(p_hal->slots, SLOTS_LEN_ALIGN, rkv_len_align);

    (void)cfg;
__RETURN:
    return MPP_OK;
__FAILED:
    vdpu_av1d_deinit(hal);

    return ret;
}